

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O1

int ndiGetGXPassiveStray(ndicapi *pol,int i,double *coord)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (pol->GxPassiveStray[0] != '\0') {
    lVar2 = ndiSignedToLong(pol->GxPassiveStray,3);
    uVar3 = (uint)lVar2;
    uVar4 = 0x14;
    if ((int)uVar3 < 0x14) {
      uVar4 = uVar3;
    }
    iVar1 = 2;
    if ((-1 < (int)uVar3) && ((uint)i < uVar4)) {
      uVar5 = (ulong)(uint)(i * 0x15);
      lVar2 = ndiSignedToLong(pol->GxPassiveStray + uVar5 + 3,7);
      *coord = (double)lVar2 * 0.01;
      lVar2 = ndiSignedToLong(pol->GxPassiveStray + uVar5 + 10,7);
      coord[1] = (double)lVar2 * 0.01;
      lVar2 = ndiSignedToLong(pol->GxPassiveStray + uVar5 + 0x11,7);
      coord[2] = (double)lVar2 * 0.01;
      iVar1 = 0;
    }
    return iVar1;
  }
  return 1;
}

Assistant:

ndicapiExport int ndiGetGXPassiveStray(ndicapi* pol, int i, double coord[3])
{
  const char* dp;
  int n;

  dp = pol->GxPassiveStray;

  if (*dp == '\0')
  {
    return NDI_DISABLED;
  }

  n = (int)ndiSignedToLong(dp, 3);
  dp += 3;
  if (n < 0)
  {
    return NDI_MISSING;
  }
  if (n > 20)
  {
    n = 20;
  }

  if (i < 0 || i >= n)
  {
    return NDI_MISSING;
  }

  dp += 7 * 3 * i;
  coord[0] = ndiSignedToLong(&dp[0],  7) * 0.01;
  coord[1] = ndiSignedToLong(&dp[7],  7) * 0.01;
  coord[2] = ndiSignedToLong(&dp[14], 7) * 0.01;

  return NDI_OKAY;
}